

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransformDerivative.cpp
# Opt level: O0

SpatialForceVector * __thiscall
iDynTree::TransformDerivative::transform
          (TransformDerivative *this,Transform *transform,SpatialForceVector *other)

{
  VectorFixSize<3U> *this_00;
  MatrixFixSize<3U,_3U> *this_01;
  MatrixBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  *this_02;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other_00;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *this_03;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_> *other_01;
  AngularVector3T *this_04;
  long in_RCX;
  Transform *in_RDX;
  VectorFixSize<3U> *in_RSI;
  SpatialForceVector *in_RDI;
  Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> dR;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> dp;
  Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> R;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> p;
  SpatialForceVector *ret;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffffd88;
  SpatialForceVector *in_stack_fffffffffffffd90;
  PointerArgType in_stack_fffffffffffffd98;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffda0;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffda8;
  MatrixBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  *in_stack_fffffffffffffe30;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffe38;
  
  SpatialForceVector::SpatialForceVector(in_stack_fffffffffffffd90);
  this_00 = &Transform::getPosition(in_RDX)->super_Vector3;
  VectorFixSize<3U>::data(this_00);
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)in_stack_fffffffffffffd90);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
             in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             (Stride<0,_0> *)in_stack_fffffffffffffd90);
  this_01 = &Transform::getRotation(in_RDX)->super_Matrix3x3;
  MatrixFixSize<3U,_3U>::data(this_01);
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)in_stack_fffffffffffffd90);
  Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)
             in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             (Stride<0,_0> *)in_stack_fffffffffffffd90);
  VectorFixSize<3U>::data(in_RSI);
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)in_stack_fffffffffffffd90);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
             in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             (Stride<0,_0> *)in_stack_fffffffffffffd90);
  MatrixFixSize<3U,_3U>::data((MatrixFixSize<3U,_3U> *)(in_RSI + 1));
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)in_stack_fffffffffffffd90);
  Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)
             in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             (Stride<0,_0> *)in_stack_fffffffffffffd90);
  this_02 = (MatrixBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
             *)SpatialVector<iDynTree::SpatialForceVector>::getLinearVec3
                         ((SpatialVector<iDynTree::SpatialForceVector> *)(in_RCX + 8));
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffda8);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>::
  operator*(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  other_00 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             SpatialVector<iDynTree::SpatialForceVector>::getLinearVec3
                       (&in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>);
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffda8);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
             in_stack_fffffffffffffd90,
             (DenseBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
              *)in_stack_fffffffffffffd88);
  this_03 = (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
             *)SpatialVector<iDynTree::SpatialForceVector>::getAngularVec3
                         ((SpatialVector<iDynTree::SpatialForceVector> *)(in_RCX + 8));
  toEigen<3U>((VectorFixSize<3U> *)this_03);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>::
  operator*(this_03,in_stack_fffffffffffffda0);
  other_01 = (MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)SpatialVector<iDynTree::SpatialForceVector>::getLinearVec3
                          (&in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>);
  toEigen<3U>((VectorFixSize<3U> *)this_03);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (in_stack_fffffffffffffe38,
             (MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffffe30);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,0>>
  ::operator+(this_02,other_00);
  SpatialVector<iDynTree::SpatialForceVector>::getLinearVec3
            ((SpatialVector<iDynTree::SpatialForceVector> *)(in_RCX + 8));
  toEigen<3U>((VectorFixSize<3U> *)this_03);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>::
  operator*(this_03,other_01);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Product<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,0>>
            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
  ::operator+((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)this_02,other_00);
  this_04 = SpatialVector<iDynTree::SpatialForceVector>::getAngularVec3
                      (&in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>);
  toEigen<3U>((VectorFixSize<3U> *)this_03);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)this_04,
             in_stack_fffffffffffffd88);
  return in_RDI;
}

Assistant:

SpatialForceVector TransformDerivative::transform(const Transform& transform,
                                                  SpatialForceVector& other)
{
    SpatialForceVector ret;

    Eigen::Map<const Eigen::Vector3d> p(transform.getPosition().data());
    Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > R(transform.getRotation().data());
    Eigen::Map<const Eigen::Vector3d> dp(this->posDerivative.data());
    Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > dR(this->rotDerivative.data());

    toEigen(ret.getLinearVec3()) = dR*toEigen(other.getLinearVec3());
    toEigen(ret.getAngularVec3())  =  dR*toEigen(other.getAngularVec3())
                                    + p.cross(toEigen(ret.getLinearVec3()))
                                    + dp.cross(R*toEigen(other.getLinearVec3()));

    return ret;
}